

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O2

void __thiscall
HighsLp::deleteRowsFromVectors
          (HighsLp *this,HighsInt *new_num_row,HighsIndexCollection *index_collection)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pdVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  HighsInt keep_to_row;
  HighsInt current_set_entry;
  HighsInt keep_from_row;
  HighsInt delete_to_row;
  HighsInt delete_from_row;
  HighsInt to_k;
  HighsInt from_k;
  HighsInt local_64;
  int local_60;
  int local_5c;
  HighsInt local_58;
  int local_54;
  int local_50;
  HighsInt local_4c;
  int local_48;
  int local_44;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  HighsIndexCollection *local_38;
  
  local_38 = index_collection;
  limits(index_collection,&local_44,&local_48);
  local_60 = this->num_row_;
  *new_num_row = local_60;
  if (local_44 <= local_48) {
    local_64 = -1;
    local_58 = 0;
    *new_num_row = 0;
    pbVar1 = (this->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = (this->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_40 = &this->row_names_;
    local_60 = local_60 + -1;
    iVar6 = local_44;
    do {
      iVar4 = local_60;
      iVar5 = (int)((ulong)((long)pbVar1 - (long)pbVar2) >> 5);
      if (local_48 < iVar6) break;
      updateOutInIndex(local_38,&local_4c,&local_50,&local_54,&local_64,&local_58);
      if (iVar6 == local_44) {
        *new_num_row = local_4c;
      }
      if (iVar4 <= local_50) break;
      local_5c = iVar6;
      for (lVar7 = (long)local_54; lVar7 <= local_64; lVar7 = lVar7 + 1) {
        pdVar3 = (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar6 = *new_num_row;
        pdVar3[iVar6] = pdVar3[lVar7];
        pdVar3 = (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3[iVar6] = pdVar3[lVar7];
        if (0 < iVar5) {
          std::__cxx11::string::_M_assign
                    ((string *)
                     ((local_40->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + iVar6));
          iVar6 = *new_num_row;
        }
        *new_num_row = iVar6 + 1;
      }
      iVar6 = local_5c + 1;
    } while (local_64 < local_60);
    std::vector<double,_std::allocator<double>_>::resize(&this->row_lower_,(long)*new_num_row);
    std::vector<double,_std::allocator<double>_>::resize(&this->row_upper_,(long)*new_num_row);
    if (0 < iVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(local_40,(long)*new_num_row);
    }
  }
  return;
}

Assistant:

void HighsLp::deleteRowsFromVectors(
    HighsInt& new_num_row, const HighsIndexCollection& index_collection) {
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Initialise new_num_row in case none is removed due to from_k > to_k
  new_num_row = this->num_row_;
  if (from_k > to_k) return;

  HighsInt delete_from_row;
  HighsInt delete_to_row;
  HighsInt keep_from_row;
  HighsInt keep_to_row = -1;
  HighsInt current_set_entry = 0;

  HighsInt row_dim = this->num_row_;
  new_num_row = 0;
  bool have_names = (HighsInt)this->row_names_.size() > 0;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_row, delete_to_row,
                     keep_from_row, keep_to_row, current_set_entry);
    if (k == from_k) {
      // Account for the initial rows being kept
      new_num_row = delete_from_row;
    }
    if (delete_to_row >= row_dim - 1) break;
    assert(delete_to_row < row_dim);
    for (HighsInt row = keep_from_row; row <= keep_to_row; row++) {
      this->row_lower_[new_num_row] = this->row_lower_[row];
      this->row_upper_[new_num_row] = this->row_upper_[row];
      if (have_names) this->row_names_[new_num_row] = this->row_names_[row];
      new_num_row++;
    }
    if (keep_to_row >= row_dim - 1) break;
  }
  this->row_lower_.resize(new_num_row);
  this->row_upper_.resize(new_num_row);
  if (have_names) this->row_names_.resize(new_num_row);
}